

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_find_set.cpp
# Opt level: O0

int __thiscall si9ma::UnionFindSet::find_header(UnionFindSet *this,int val)

{
  int iVar1;
  bool bVar2;
  mapped_type *pmVar3;
  reference __k;
  undefined1 local_68 [8];
  stack<int,_std::deque<int,_std::allocator<int>_>_> s_stack;
  int val_local;
  UnionFindSet *this_local;
  
  s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._4_4_ = val;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)local_68);
  while (iVar1 = s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node._4_4_,
        pmVar3 = std::
                 unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 ::operator[](&this->father_map,
                              (key_type *)
                              ((long)&s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl
                                      .super__Deque_impl_data._M_finish._M_node + 4)),
        iVar1 != *pmVar3) {
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68,
               (value_type *)
               ((long)&s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 4));
    pmVar3 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->father_map,
                          (key_type *)
                          ((long)&s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                  super__Deque_impl_data._M_finish._M_node + 4));
    s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_node._4_4_ = *pmVar3;
  }
  while (bVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68),
        iVar1 = s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node._4_4_, ((bVar2 ^ 0xffU) & 1) != 0) {
    __k = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                    ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    pmVar3 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->father_map,__k);
    *pmVar3 = iVar1;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
  }
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
  return iVar1;
}

Assistant:

int UnionFindSet::find_header(int val) {
        stack<int> s_stack;
        while (val != father_map[val]){
            s_stack.push(val);
            val = father_map[val];
        }

        while (!s_stack.empty()){
            father_map[s_stack.top()] = val;
            s_stack.pop();
        }

        return val;
    }